

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

void connect_and_kill(int ServerPort)

{
  CManager p_Var1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  _KillServerMsg kill_msg;
  Remote_evpath_state ev_state;
  
  p_Var1 = (CManager)CManager_create();
  uVar2 = create_attr_list();
  uVar3 = attr_atom_from_string("IP_HOST");
  uVar4 = attr_atom_from_string("IP_PORT");
  add_attr(uVar2,uVar3,3,"localhost");
  add_attr(uVar2,uVar4,1,(long)ServerPort);
  lVar6 = CMinitiate_conn(p_Var1,uVar2);
  if (lVar6 == 0) {
    return;
  }
  ev_state.cm = p_Var1;
  adios2::EVPathRemoteCommon::RegisterFormats(&ev_state);
  ServerRegisterHandlers(&ev_state);
  kill_msg.KillResponseCondition = 0;
  kill_msg._4_4_ = 0;
  kill_msg.unused = 0;
  iVar5 = CMCondition_get(ev_state.cm,lVar6);
  kill_msg.KillResponseCondition = iVar5;
  CMwrite(lVar6,ev_state.KillServerFormat,&kill_msg);
  CMCondition_wait(ev_state.cm,kill_msg._0_8_ & 0xffffffff);
  exit(0);
}

Assistant:

void connect_and_kill(int ServerPort)
{
    CManager cm = CManager_create();
    _KillServerMsg kill_msg;
    struct Remote_evpath_state ev_state;
    attr_list contact_list = create_attr_list();
    atom_t CM_IP_PORT = -1;
    atom_t CM_IP_HOSTNAME = -1;
    CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
    CM_IP_PORT = attr_atom_from_string("IP_PORT");
    add_attr(contact_list, CM_IP_HOSTNAME, Attr_String, (attr_value)hostname);
    add_attr(contact_list, CM_IP_PORT, Attr_Int4, (attr_value)ServerPort);
    CMConnection conn = CMinitiate_conn(cm, contact_list);
    if (!conn)
        return;

    ev_state.cm = cm;

    RegisterFormats(ev_state);

    ServerRegisterHandlers(ev_state);

    memset(&kill_msg, 0, sizeof(kill_msg));
    kill_msg.KillResponseCondition = CMCondition_get(ev_state.cm, conn);
    CMwrite(conn, ev_state.KillServerFormat, &kill_msg);
    CMCondition_wait(ev_state.cm, kill_msg.KillResponseCondition);
    exit(0);
}